

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearlyTransformedCosines.cpp
# Opt level: O3

void __thiscall
arealights::LinearlyTransformedCosines::loadLookupTextures(LinearlyTransformedCosines *this)

{
  Texture *pTVar1;
  LinearlyTransformedCosines *pLVar2;
  GLenum GVar3;
  Writer *pWVar4;
  Texture *pTVar5;
  string *psVar6;
  pointer *__ptr;
  alf_file *local_b8;
  uint ltcMatB;
  uint ltcMatA;
  undefined1 local_a8 [32];
  char *local_88;
  VerboseLevel local_80;
  Logger *local_78;
  bool local_70;
  Logger *local_68;
  char *local_60;
  DispatchAction local_58;
  pointer local_50;
  pointer pbStack_48;
  pointer local_40;
  LinearlyTransformedCosines *local_38;
  
  local_a8._0_8_ = local_a8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a8,"../assets/lookups/result_64x64.ltc","");
  read_alf_file((arealights *)&local_b8,(string *)local_a8);
  if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
    operator_delete((void *)local_a8._0_8_,(ulong)(local_a8._16_8_ + 1));
  }
  if (local_b8 != (alf_file *)0x0) {
    local_38 = this;
    (*glad_glGenTextures)(1,&ltcMatA);
    (*glad_glGenTextures)(1,&ltcMatB);
    (*glad_glActiveTexture)(0x84c0);
    (*glad_glBindTexture)(0xde1,ltcMatA);
    (*glad_glTexParameteri)(0xde1,0x2801,0x2600);
    (*glad_glTexParameteri)(0xde1,0x2800,0x2601);
    (*glad_glTexParameteri)(0xde1,0x2802,0x812f);
    (*glad_glTexParameteri)(0xde1,0x2803,0x812f);
    (*glad_glTexImage2D)
              (0xde1,0,0x8814,(local_b8->header).num_samples_roughness,
               (local_b8->header).num_samples_angle,0,0x1908,0x1406,
               (local_b8->texture_slot1).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
    while( true ) {
      GVar3 = (*glad_glGetError)();
      if (GVar3 == 0) break;
      local_a8._0_8_ = &PTR__Writer_001f54f0;
      local_a8._8_4_ = Error;
      local_a8._16_8_ =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/source/LinearlyTransformedCosines.cpp"
      ;
      local_a8._24_8_ = 0x91;
      local_88 = "void arealights::LinearlyTransformedCosines::loadLookupTextures()";
      local_80 = 0;
      local_78 = (Logger *)0x0;
      local_70 = false;
      local_68 = (Logger *)0x0;
      local_60 = "";
      local_58 = NormalLog;
      local_40 = (pointer)0x0;
      local_50 = (pointer)0x0;
      pbStack_48 = (pointer)0x0;
      pWVar4 = el::base::Writer::construct((Writer *)local_a8,1,"framework");
      if (pWVar4->m_proceed == true) {
        el::base::MessageBuilder::operator<<(&pWVar4->m_messageBuilder,GVar3);
      }
      el::base::Writer::~Writer((Writer *)local_a8);
    }
    (*glad_glBindTexture)(0xde1,ltcMatB);
    (*glad_glTexParameteri)(0xde1,0x2801,0x2600);
    (*glad_glTexParameteri)(0xde1,0x2800,0x2601);
    (*glad_glTexParameteri)(0xde1,0x2802,0x812f);
    (*glad_glTexParameteri)(0xde1,0x2803,0x812f);
    (*glad_glTexImage2D)
              (0xde1,0,0x8815,(local_b8->header).num_samples_roughness,
               (local_b8->header).num_samples_angle,0,0x1907,0x1406,
               (local_b8->texture_slot2).super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
    while( true ) {
      GVar3 = (*glad_glGetError)();
      if (GVar3 == 0) break;
      local_a8._0_8_ = &PTR__Writer_001f54f0;
      local_a8._8_4_ = Error;
      local_a8._16_8_ =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/sienkiewiczkm[P]arealights/source/LinearlyTransformedCosines.cpp"
      ;
      local_a8._24_8_ = 0xa0;
      local_88 = "void arealights::LinearlyTransformedCosines::loadLookupTextures()";
      local_80 = 0;
      local_78 = (Logger *)0x0;
      local_70 = false;
      local_68 = (Logger *)0x0;
      local_60 = "";
      local_58 = NormalLog;
      local_40 = (pointer)0x0;
      local_50 = (pointer)0x0;
      pbStack_48 = (pointer)0x0;
      pWVar4 = el::base::Writer::construct((Writer *)local_a8,1,"framework");
      if (pWVar4->m_proceed == true) {
        el::base::MessageBuilder::operator<<(&pWVar4->m_messageBuilder,GVar3);
      }
      el::base::Writer::~Writer((Writer *)local_a8);
    }
    (*glad_glBindTexture)(0xde1,0);
    pTVar5 = (Texture *)operator_new(0x30);
    fw::Texture::Texture(pTVar5,ltcMatA);
    pLVar2 = local_38;
    pTVar1 = (local_38->_ltcLookupMatA)._M_t.
             super___uniq_ptr_impl<fw::Texture,_std::default_delete<fw::Texture>_>._M_t.
             super__Tuple_impl<0UL,_fw::Texture_*,_std::default_delete<fw::Texture>_>.
             super__Head_base<0UL,_fw::Texture_*,_false>._M_head_impl;
    (local_38->_ltcLookupMatA)._M_t.
    super___uniq_ptr_impl<fw::Texture,_std::default_delete<fw::Texture>_>._M_t.
    super__Tuple_impl<0UL,_fw::Texture_*,_std::default_delete<fw::Texture>_>.
    super__Head_base<0UL,_fw::Texture_*,_false>._M_head_impl = pTVar5;
    if (pTVar1 != (Texture *)0x0) {
      (*pTVar1->_vptr_Texture[1])();
    }
    pTVar5 = (Texture *)operator_new(0x30);
    fw::Texture::Texture(pTVar5,ltcMatB);
    pTVar1 = (pLVar2->_ltcLookupMatB)._M_t.
             super___uniq_ptr_impl<fw::Texture,_std::default_delete<fw::Texture>_>._M_t.
             super__Tuple_impl<0UL,_fw::Texture_*,_std::default_delete<fw::Texture>_>.
             super__Head_base<0UL,_fw::Texture_*,_false>._M_head_impl;
    (pLVar2->_ltcLookupMatB)._M_t.
    super___uniq_ptr_impl<fw::Texture,_std::default_delete<fw::Texture>_>._M_t.
    super__Tuple_impl<0UL,_fw::Texture_*,_std::default_delete<fw::Texture>_>.
    super__Head_base<0UL,_fw::Texture_*,_false>._M_head_impl = pTVar5;
    if (pTVar1 != (Texture *)0x0) {
      (*pTVar1->_vptr_Texture[1])();
    }
    if (local_b8 != (alf_file *)0x0) {
      std::default_delete<arealights::alf_file>::operator()
                ((default_delete<arealights::alf_file> *)&local_b8,local_b8);
    }
    return;
  }
  psVar6 = (string *)__cxa_allocate_exception(0x20);
  *(string **)psVar6 = psVar6 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>(psVar6,"Cannot load LTC lookup tables.","");
  __cxa_throw(psVar6,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void LinearlyTransformedCosines::loadLookupTextures()
{
    auto lookup_alf = read_alf_file("../assets/lookups/result_64x64.ltc");

    if (!lookup_alf) {
        throw std::string("Cannot load LTC lookup tables.");
    }

    unsigned int ltcMatA, ltcMatB;
    glGenTextures(1, &ltcMatA);
    glGenTextures(1, &ltcMatB);

    glActiveTexture(GL_TEXTURE0);

    glBindTexture(GL_TEXTURE_2D, ltcMatA);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);

    glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA32F,
        lookup_alf->header.num_samples_roughness, lookup_alf->header.num_samples_angle,
        0, GL_RGBA, GL_FLOAT, lookup_alf->texture_slot1.data());

    GLenum err;
    while((err = glGetError()) != GL_NO_ERROR)
    {
        LOG(ERROR) << err;
    }

    glBindTexture(GL_TEXTURE_2D, ltcMatB);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
    glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);

    glTexImage2D(GL_TEXTURE_2D, 0, GL_RGB32F,
        lookup_alf->header.num_samples_roughness, lookup_alf->header.num_samples_angle,
        0, GL_RGB, GL_FLOAT, lookup_alf->texture_slot2.data());

    while((err = glGetError()) != GL_NO_ERROR)
    {
        LOG(ERROR) << err;
    }

    glBindTexture(GL_TEXTURE_2D, 0);

    _ltcLookupMatA = std::make_unique<fw::Texture>(ltcMatA);
    _ltcLookupMatB = std::make_unique<fw::Texture>(ltcMatB);
}